

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O2

void __thiscall
bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::move
          (left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *this
          ,left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>
           *other)

{
  size_type sVar1;
  uint uVar2;
  
  detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::clear
            ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)this,true
            );
  uVar2 = *(uint *)&(other->super_type).
                    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                    .field_0x8 & 0x7fffffff;
  if (((other->super_type).
       super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ -
      (other->super_type).
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_) +
      uVar2 < 0x21) {
    copy(this,(EVP_PKEY_CTX *)other,(EVP_PKEY_CTX *)(ulong)uVar2);
    detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::clear
              ((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)other,
               true);
    return;
  }
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
       (other->super_type).
       super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_;
  uVar2 = *(uint *)&(other->super_type).
                    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                    .field_0x8 & 0x7fffffff;
  *(uint *)&(this->super_type).
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x8 =
       *(uint *)&(this->super_type).
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 field_0x8 & 0x80000000 | uVar2;
  *(uint *)&(this->super_type).
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x8 =
       *(uint *)&(other->super_type).
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 field_0x8 & 0x80000000 | uVar2;
  sVar1 = (other->super_type).
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_;
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ =
       (other->super_type).
       super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_;
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = sVar1;
  (other->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
       &(other->super_type).
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14;
  *(undefined8 *)
   &(other->super_type).
    super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x8 =
       0x20;
  (other->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0x20;
  return;
}

Assistant:

void move(left_right_sequence& other) {
		this->clear(true);
		if (other.raw_size() <= base_type::inline_raw_cap) {
			copy(other);
			other.clear(true);
		}
		else {
			this->buf_   = other.buf_;
			this->cap_   = other.cap_;
			this->free_  = other.free_;
			this->left_  = other.left_;
			this->right_ = other.right_;
			other.buf_  = other.extra();
			other.cap_  = base_type::inline_raw_cap;
			other.free_ = 0;
			other.left_ = 0;
			other.right_= base_type::inline_raw_cap;
		}
	}